

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cc
# Opt level: O1

btree_result btree_remove(btree *btree,void *key)

{
  ushort uVar1;
  ushort uVar2;
  uint16_t uVar3;
  _func_voidref_void_ptr_bid_t *p_Var4;
  _func_void_bnode_ptr_idx_t_void_ptr_void_ptr *p_Var5;
  _func_bid_t_void_ptr *p_Var6;
  code *pcVar7;
  _func_voidref_bid_t_ptr *p_Var8;
  _func_void_void_ptr_bid_t *p_Var9;
  _func_size_t_void_ptr_bid_t *p_Var10;
  _func_size_t_bnode_ptr_void_ptr_void_ptr_void_ptr_size_t *p_Var11;
  _func_voidref_void_ptr_bid_t_ptr *p_Var12;
  _func_void_bnode_ptr_bnode_ptr_idx_t_idx_t_idx_t *p_Var13;
  _func_int_void_ptr_bid_t *p_Var14;
  _func_voidref_void_ptr_bid_t_bid_t_ptr *p_Var15;
  _func_void_void_ptr *p_Var16;
  size_t __n;
  undefined1 *puVar17;
  undefined1 *puVar18;
  bnode *pbVar19;
  void *pvVar20;
  idx_t iVar21;
  metasize_t mVar22;
  int iVar23;
  bnode *node_2;
  ulong uVar24;
  bnode *pbVar25;
  bid_t bVar26;
  voidref pvVar27;
  size_t sVar28;
  bnode *pbVar29;
  btree_print_func *pbVar30;
  undefined1 *puVar31;
  ushort *puVar32;
  undefined1 *puVar33;
  btree_result bVar34;
  bnode *node;
  void *pvVar35;
  ulong uVar36;
  uint uVar37;
  long lVar38;
  void *pvVar39;
  long lVar40;
  undefined1 *puVar41;
  bool bVar42;
  ulong uStack_e0;
  bid_t abStack_d8 [2];
  undefined1 auStack_c8 [8];
  ulong local_c0;
  bid_t _bid;
  bid_t new_root_bid;
  ulong local_a8;
  ulong local_a0;
  size_t local_98;
  undefined1 *local_90;
  void *local_88;
  long local_80;
  long local_78;
  void *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  bnode *local_48;
  undefined1 *local_40;
  void *local_38;
  
  local_88 = key;
  uVar24 = (ulong)(btree->ksize + 0xf & 0xfffffff0);
  puVar41 = auStack_c8 + -uVar24;
  uVar36 = (ulong)(btree->vsize + 0xf & 0xfffffff0);
  local_40 = puVar41 + -uVar36;
  local_50 = local_40 + -uVar24;
  local_68 = local_50 + -uVar36;
  uVar1 = btree->height;
  local_80 = (long)(local_50 + -uVar36) - (ulong)((uint)uVar1 * 2 + 0xf & 0xfffffff0);
  uVar24 = (ulong)((uint)uVar1 * 8 + 0xf & 0xfffffff0);
  lVar38 = local_80 - uVar24;
  uVar36 = (ulong)(uVar1 + 0xf & 0xfffffff0);
  pvVar39 = (void *)(lVar38 - uVar36);
  pvVar35 = (void *)((long)pvVar39 - uVar36);
  puVar33 = (undefined1 *)((long)pvVar35 - uVar36);
  puVar31 = puVar33 + -uVar24;
  local_60 = puVar31;
  local_58 = puVar33;
  if (uVar1 != 0) {
    local_38 = (void *)(ulong)uVar1;
    *(undefined8 *)(puVar31 + -8) = 0x118ce1;
    memset(puVar33,0,(ulong)uVar1);
    pvVar20 = local_38;
    *(undefined8 *)(puVar31 + -8) = 0x118cef;
    memset(pvVar39,0,(size_t)pvVar20);
    pvVar20 = local_38;
    *(undefined8 *)(puVar31 + -8) = 0x118cfd;
    memset(pvVar35,0,(size_t)pvVar20);
  }
  puVar33 = local_40;
  local_70 = pvVar35;
  local_38 = pvVar39;
  pbVar30 = btree->kv_ops->init_kv_var;
  if (pbVar30 != (btree_print_func *)0x0) {
    *(undefined8 *)(puVar31 + -8) = 0x118d22;
    (*pbVar30)(btree,puVar41,puVar33);
    puVar17 = local_50;
    puVar33 = local_68;
    pbVar30 = btree->kv_ops->init_kv_var;
    *(undefined8 *)(puVar31 + -8) = 0x118d34;
    (*pbVar30)(btree,puVar17,puVar33);
  }
  *local_58 = 1;
  uVar1 = btree->height;
  *(bid_t *)(lVar38 + -8 + (ulong)uVar1 * 8) = btree->root_bid;
  if (uVar1 != 0) {
    lVar40 = (ulong)uVar1 + 1;
    do {
      pvVar35 = btree->blk_handle;
      bVar26 = *(bid_t *)(lVar38 + -0x10 + lVar40 * 8);
      p_Var4 = btree->blk_ops->blk_read;
      *(undefined8 *)(puVar31 + -8) = 0x118d65;
      pbVar25 = (bnode *)(*p_Var4)(pvVar35,bVar26);
      pvVar35 = local_88;
      pbVar29 = pbVar25 + 1;
      if ((pbVar25->flag & 2) != 0) {
        pbVar29 = (bnode *)((long)&pbVar29->kvsize +
                           (ulong)((ushort)(pbVar29->kvsize << 8 | pbVar29->kvsize >> 8) + 0x11 &
                                  0xfffffff0));
      }
      (pbVar25->field_4).data = pbVar29;
      *(bnode **)(local_60 + lVar40 * 8 + -0x10) = pbVar25;
      *(undefined8 *)(puVar31 + -8) = 0x118da4;
      iVar21 = _btree_find_entry(btree,pbVar25,pvVar35);
      puVar33 = local_40;
      *(idx_t *)(local_80 + -4 + lVar40 * 2) = iVar21;
      if (iVar21 == 0xffff) {
        p_Var16 = btree->blk_ops->blk_operation_end;
        if (p_Var16 != (_func_void_void_ptr *)0x0) {
          pvVar35 = btree->blk_handle;
          *(undefined8 *)(puVar31 + -8) = 0x11927d;
          (*p_Var16)(pvVar35);
        }
        pbVar30 = btree->kv_ops->free_kv_var;
        bVar34 = BTREE_RESULT_FAIL;
        goto LAB_0011928b;
      }
      p_Var5 = btree->kv_ops->get_kv;
      *(undefined8 *)(puVar31 + -8) = 0x118dcc;
      (*p_Var5)(pbVar25,iVar21,puVar41,puVar33);
      puVar33 = local_40;
      if (lVar40 != 2) {
        p_Var6 = btree->kv_ops->value2bid;
        *(undefined8 *)(puVar31 + -8) = 0x118ddd;
        bVar26 = (*p_Var6)(puVar33);
        *(bid_t *)(lVar38 + -0x18 + lVar40 * 8) =
             bVar26 >> 0x38 | (bVar26 & 0xff000000000000) >> 0x28 |
             (bVar26 & 0xff0000000000) >> 0x18 | (bVar26 & 0xff00000000) >> 8 |
             (bVar26 & 0xff000000) << 8 | (bVar26 & 0xff0000) << 0x18 | (bVar26 & 0xff00) << 0x28 |
             bVar26 << 0x38;
      }
      lVar40 = lVar40 + -1;
    } while (1 < lVar40);
  }
  if (btree->height != 0) {
    pvVar35 = (void *)0x0;
    uVar24 = 1;
    local_78 = lVar38;
    do {
      puVar17 = local_40;
      puVar33 = local_60;
      local_88 = pvVar35;
      if (uVar24 != 1) {
        pbVar25 = *(bnode **)(local_60 + uVar24 * 8 + -8);
        iVar21 = *(idx_t *)(local_80 + -2 + uVar24 * 2);
        p_Var5 = btree->kv_ops->get_kv;
        local_48 = pbVar25;
        *(undefined8 *)(puVar31 + -8) = 0x118e3f;
        (*p_Var5)(pbVar25,iVar21,puVar41,puVar17);
        puVar18 = local_50;
        puVar17 = local_68;
        pbVar25 = *(bnode **)(puVar33 + uVar24 * 8 + -0x10);
        if (pbVar25->nentry != 0) {
          p_Var5 = btree->kv_ops->get_kv;
          *(undefined8 *)(puVar31 + -8) = 0x118e5e;
          (*p_Var5)(pbVar25,0,puVar18,puVar17);
          pvVar35 = btree->aux;
          pcVar7 = (code *)btree->kv_ops->cmp;
          *(undefined8 *)(puVar31 + -8) = 0x118e6f;
          iVar23 = (*pcVar7)(puVar18,puVar41,pvVar35);
          puVar17 = local_40;
          pbVar25 = local_48;
          puVar33 = local_50;
          if (iVar23 != 0) {
            p_Var5 = btree->kv_ops->set_kv;
            *(undefined8 *)(puVar31 + -8) = 0x118e8c;
            (*p_Var5)(pbVar25,iVar21,puVar33,puVar17);
            pbVar30 = btree->kv_ops->set_key;
            *(undefined8 *)(puVar31 + -8) = 0x118e9c;
            (*pbVar30)(btree,puVar41,puVar33);
            *(undefined1 *)((long)local_38 + (uVar24 - 1)) = 1;
          }
        }
        if (*(char *)((long)local_70 + (uVar24 - 2)) != '\0') {
          uVar36 = *(ulong *)(local_78 + -0x10 + uVar24 * 8);
          local_c0 = uVar36 >> 0x38 | (uVar36 & 0xff000000000000) >> 0x28 |
                     (uVar36 & 0xff0000000000) >> 0x18 | (uVar36 & 0xff00000000) >> 8 |
                     (uVar36 & 0xff000000) << 8 | (uVar36 & 0xff0000) << 0x18 |
                     (uVar36 & 0xff00) << 0x28 | uVar36 << 0x38;
          p_Var5 = btree->kv_ops->set_kv;
          p_Var8 = btree->kv_ops->bid2value;
          *(undefined8 *)(puVar31 + -8) = 0x118ed7;
          pvVar27 = (*p_Var8)(&local_c0);
          pbVar25 = local_48;
          *(undefined8 *)(puVar31 + -8) = 0x118ee7;
          (*p_Var5)(pbVar25,iVar21,puVar41,pvVar27);
          *(undefined1 *)((long)local_38 + (uVar24 - 1)) = 1;
        }
      }
      puVar33 = local_40;
      lVar38 = local_78;
      if (local_58[uVar24 - 1] != '\0') {
        pbVar25 = *(bnode **)(local_60 + uVar24 * 8 + -8);
        iVar21 = *(idx_t *)(local_80 + -2 + uVar24 * 2);
        p_Var5 = btree->kv_ops->get_kv;
        *(undefined8 *)(puVar31 + -8) = 0x118f28;
        (*p_Var5)(pbVar25,iVar21,puVar41,puVar33);
        if (pbVar25->nentry != 0) {
          *(undefined8 *)(puVar31 + -8) = 0x118f3f;
          iVar21 = _btree_find_entry(btree,pbVar25,puVar41);
          if (iVar21 != 0xffff) {
            p_Var5 = btree->kv_ops->ins_kv;
            *(undefined8 *)(puVar31 + -8) = 0x118f57;
            (*p_Var5)(pbVar25,iVar21,(void *)0x0,(void *)0x0);
            pbVar25->nentry = pbVar25->nentry - 1;
          }
        }
        *(undefined1 *)((long)local_38 + (uVar24 - 1)) = 1;
        if ((((pbVar25->nentry == 0) && (uVar24 < btree->height)) ||
            ((pbVar25->nentry < 2 && (uVar24 == btree->height)))) && (1 < btree->height)) {
          pvVar35 = btree->blk_handle;
          bVar26 = *(bid_t *)(lVar38 + -8 + uVar24 * 8);
          p_Var9 = btree->blk_ops->blk_remove;
          *(undefined8 *)(puVar31 + -8) = 0x118fad;
          (*p_Var9)(pvVar35,bVar26);
          puVar33 = local_40;
          if (uVar24 < btree->height) {
            local_58[uVar24] = 1;
          }
          else {
            puVar31 = puVar31 + -((ulong)btree->blksize + 0xf & 0xfffffffffffffff0);
            p_Var5 = btree->kv_ops->get_kv;
            local_90 = puVar31;
            *(undefined8 *)(puVar31 + -8) = 0x118ff4;
            (*p_Var5)(pbVar25,0,puVar41,puVar33);
            p_Var6 = btree->kv_ops->value2bid;
            *(undefined8 *)(puVar31 + -8) = 0x118ffe;
            bVar26 = (*p_Var6)(puVar33);
            uVar36 = bVar26 >> 0x38 | (bVar26 & 0xff000000000000) >> 0x28 |
                     (bVar26 & 0xff0000000000) >> 0x18 | (bVar26 & 0xff00000000) >> 8 |
                     (bVar26 & 0xff000000) << 8 | (bVar26 & 0xff0000) << 0x18 |
                     (bVar26 & 0xff00) << 0x28 | bVar26 << 0x38;
            pvVar35 = btree->blk_handle;
            p_Var4 = btree->blk_ops->blk_read;
            *(undefined8 *)(puVar31 + -8) = 0x119012;
            local_48 = (bnode *)(*p_Var4)(pvVar35,uVar36);
            pbVar25 = local_48 + 1;
            if ((local_48->flag & 2) != 0) {
              pbVar25 = (bnode *)((long)&pbVar25->kvsize +
                                 (ulong)((ushort)(pbVar25->kvsize << 8 | pbVar25->kvsize >> 8) +
                                         0x11 & 0xfffffff0));
            }
            (local_48->field_4).data = pbVar25;
            pvVar35 = btree->blk_handle;
            p_Var10 = btree->blk_ops->blk_get_size;
            local_a8 = uVar36;
            *(undefined8 *)(puVar31 + -8) = 0x119050;
            sVar28 = (*p_Var10)(pvVar35,uVar36);
            puVar33 = local_90;
            new_root_bid = (bid_t)((int)sVar28 - 1);
            *(undefined8 *)(puVar31 + -8) = 0x119068;
            mVar22 = btree_read_meta(btree,puVar33);
            pbVar25 = local_48;
            uVar37 = mVar22 + 0x11 & 0xfffffff0;
            uVar36 = (ulong)uVar37;
            p_Var11 = btree->kv_ops->get_data_size;
            *(undefined8 *)(puVar31 + -8) = 0x119089;
            sVar28 = (*p_Var11)(pbVar25,(void *)0x0,(void *)0x0,(void *)0x0,0);
            if (mVar22 == 0) {
              uVar37 = 0;
            }
            lVar38 = local_78;
            local_a0 = uVar36;
            local_98 = (ulong)mVar22;
            if ((int)sVar28 + uVar37 + 0x10 < (uint)new_root_bid) {
              btree->height = btree->height - 1;
              pvVar35 = btree->blk_handle;
              p_Var12 = btree->blk_ops->blk_alloc;
              *(undefined8 *)(puVar31 + -8) = 0x1190cc;
              pbVar29 = (bnode *)(*p_Var12)(pvVar35,&_bid);
              puVar33 = local_90;
              __n = local_98;
              uVar1 = btree->root_flag;
              uVar2._0_1_ = btree->ksize;
              uVar2._1_1_ = btree->vsize;
              uVar3 = btree->height;
              pbVar29->kvsize = uVar2 << 8 | uVar2 >> 8;
              pbVar29->nentry = 0;
              pbVar29->level = uVar3;
              pbVar29->flag = uVar1;
              pbVar25 = pbVar29;
              if ((uVar1 & 2) != 0) {
                pbVar29[1].kvsize = (ushort)local_98 << 8 | (ushort)local_98 >> 8;
                *(undefined8 *)(puVar31 + -8) = 0x119128;
                memcpy(&pbVar29[1].flag,puVar33,__n);
                pbVar25 = (bnode *)((long)&pbVar29->kvsize + local_a0);
              }
              pbVar19 = local_48;
              (pbVar29->field_4).data = pbVar25 + 1;
              pbVar25 = pbVar29 + 1;
              if ((pbVar29->flag & 2) != 0) {
                pbVar25 = (bnode *)((long)&pbVar25->kvsize +
                                   (ulong)((ushort)(pbVar25->kvsize << 8 | pbVar25->kvsize >> 8) +
                                           0x11 & 0xfffffff0));
              }
              (pbVar29->field_4).data = pbVar25;
              iVar21 = local_48->nentry;
              p_Var13 = btree->kv_ops->copy_kv;
              *(undefined8 *)(puVar31 + -8) = 0x119179;
              (*p_Var13)(pbVar29,pbVar19,0,0,iVar21);
              uVar36 = local_a8;
              pbVar29->nentry = pbVar19->nentry;
              pvVar35 = btree->blk_handle;
              p_Var9 = btree->blk_ops->blk_remove;
              *(undefined8 *)(puVar31 + -8) = 0x119196;
              (*p_Var9)(pvVar35,uVar36);
              btree->root_bid = _bid;
              *(undefined1 *)((long)local_38 + (uVar24 - 1)) = 0;
              lVar38 = local_78;
            }
          }
        }
      }
      pvVar35 = local_88;
      if (*(char *)((long)local_38 + (uVar24 - 1)) != '\0') {
        pvVar39 = btree->blk_handle;
        bVar26 = *(bid_t *)(lVar38 + -8 + uVar24 * 8);
        p_Var14 = btree->blk_ops->blk_is_writable;
        *(undefined8 *)(puVar31 + -8) = 0x1191cf;
        iVar23 = (*p_Var14)(pvVar39,bVar26);
        pvVar39 = btree->blk_handle;
        bVar26 = *(bid_t *)(lVar38 + -8 + uVar24 * 8);
        if (iVar23 == 0) {
          p_Var15 = btree->blk_ops->blk_move;
          *(undefined8 *)(puVar31 + -8) = 0x1191ec;
          pvVar27 = (*p_Var15)(pvVar39,bVar26,(bid_t *)((long)pvVar35 + lVar38));
          puVar32 = (ushort *)((long)pvVar27 + 0x10);
          if ((*(byte *)((long)pvVar27 + 2) & 2) != 0) {
            puVar32 = (ushort *)
                      ((long)puVar32 +
                      (ulong)((ushort)(*puVar32 << 8 | *puVar32 >> 8) + 0x11 & 0xfffffff0));
          }
          *(ushort **)((long)pvVar27 + 8) = puVar32;
          *(voidref *)(local_60 + uVar24 * 8 + -8) = pvVar27;
          *(undefined1 *)((long)local_70 + (uVar24 - 1)) = 1;
          if (uVar24 == btree->height) {
            btree->root_bid = *(bid_t *)(lVar38 + -8 + uVar24 * 8);
          }
        }
        else {
          p_Var9 = btree->blk_ops->blk_set_dirty;
          *(undefined8 *)(puVar31 + -8) = 0x1191e3;
          (*p_Var9)(pvVar39,bVar26);
        }
      }
      pvVar35 = (void *)((long)pvVar35 + 8);
      bVar42 = uVar24 < btree->height;
      uVar24 = uVar24 + 1;
    } while (bVar42);
  }
  p_Var16 = btree->blk_ops->blk_operation_end;
  if (p_Var16 != (_func_void_void_ptr *)0x0) {
    pvVar35 = btree->blk_handle;
    *(undefined8 *)(puVar31 + -8) = 0x11925d;
    (*p_Var16)(pvVar35);
  }
  pbVar30 = btree->kv_ops->free_kv_var;
  bVar34 = BTREE_RESULT_SUCCESS;
LAB_0011928b:
  puVar33 = local_40;
  if (pbVar30 != (btree_print_func *)0x0) {
    *(undefined8 *)(puVar31 + -8) = 0x11929c;
    (*pbVar30)(btree,puVar41,puVar33);
    puVar41 = local_50;
    puVar33 = local_68;
    pbVar30 = btree->kv_ops->free_kv_var;
    *(undefined8 *)(puVar31 + -8) = 0x1192ae;
    (*pbVar30)(btree,puVar41,puVar33);
  }
  return bVar34;
}

Assistant:

btree_result btree_remove(struct btree *btree, void *key)
{
    void *addr;
    uint8_t *k = alca(uint8_t, btree->ksize);
    uint8_t *v= alca(uint8_t, btree->vsize);
    uint8_t *kk = alca(uint8_t, btree->ksize);
    uint8_t *vv = alca(uint8_t, btree->vsize);
    // index# and block ID for each level
    idx_t *idx = alca(idx_t, btree->height);
    bid_t *bid= alca(bid_t, btree->height);
    bid_t _bid;
    // flags
    int8_t *modified = alca(int8_t, btree->height);
    int8_t *moved = alca(int8_t, btree->height);
    int8_t *rmv = alca(int8_t, btree->height);
    // index# of removed key
    idx_t *idx_rmv = alca(idx_t, btree->height);
    struct bnode **node = alca(struct bnode *, btree->height);
    int i;

    // initialize flags
    for (i=0;i<btree->height;++i) {
        moved[i] = modified[i] = rmv[i] = 0;
    }
    if (btree->kv_ops->init_kv_var) {
        btree->kv_ops->init_kv_var(btree, k, v);
        btree->kv_ops->init_kv_var(btree, kk, vv);
    }

    rmv[0] = 1;

    // set root
    bid[btree->height-1] = btree->root_bid;

    // find path from root to leaf
    for (i=btree->height-1; i>=0; --i) {
        // read block using bid
        addr = btree->blk_ops->blk_read(btree->blk_handle, bid[i]);
        // fetch node structure from block
        node[i] = _fetch_bnode(btree, addr, i+1);

        // lookup key in current node
        idx[i] = _btree_find_entry(btree, node[i], key);

        if (idx[i] == BTREE_IDX_NOT_FOUND) {
            // not found
            if (btree->blk_ops->blk_operation_end)
                btree->blk_ops->blk_operation_end(btree->blk_handle);
            if (btree->kv_ops->free_kv_var) {
                btree->kv_ops->free_kv_var(btree, k, v);
                btree->kv_ops->free_kv_var(btree, kk, vv);
            }
            return BTREE_RESULT_FAIL;
        }

        btree->kv_ops->get_kv(node[i], idx[i], k, v);

        if (i>0) {
            // index (non-leaf) node
            // get bid of child node from value
            bid[i-1] = btree->kv_ops->value2bid(v);
            bid[i-1] = _endian_decode(bid[i-1]);
        }else{
            // leaf node
        }
    }

    // cascaded remove from leaf to root
    for (i=0;i<btree->height;++i){
        // in case of index node
        if (i > 0) {
            btree->kv_ops->get_kv(node[i], idx[i], k, v);

            // when child node's smallest key is changed due to remove
              if (node[i-1]->nentry > 0) {
                btree->kv_ops->get_kv(node[i-1], 0, kk, vv);
                if (btree->kv_ops->cmp(kk, k, btree->aux)) {
                    // change current node's corresponding key
                    btree->kv_ops->set_kv(node[i], idx[i], kk, v);
                    //memcpy(k, kk, btree->ksize);
                    btree->kv_ops->set_key(btree, k, kk);
                    modified[i] = 1;
                }
            }

            // when child node is moved to new block
            if (moved[i-1]) {
                // replace the bid (value)
                _bid = _endian_encode(bid[i-1]);
                btree->kv_ops->set_kv(node[i], idx[i], k,
                                      btree->kv_ops->bid2value(&_bid));
                modified[i] = 1;
            }
        }

        if (rmv[i]) {
            // there is a key-value pair to be removed
            btree->kv_ops->get_kv(node[i], idx[i], k, v);
            idx_rmv[i] = _btree_remove_entry(btree, node[i], k);
            modified[i] = 1;

            /*
            remove the node when
            1. non-root node has no kv-pair or
            2. root node has less or equal than one kv-pair
            */
            if (((node[i]->nentry < 1 && i+1 < btree->height) ||
                (node[i]->nentry <= 1 && i+1 == btree->height)) &&
                btree->height > 1) {
                // remove the node
                btree->blk_ops->blk_remove(btree->blk_handle, bid[i]);
                if (i+1 < btree->height) {
                    // if non-root node
                    rmv[i+1] = 1;
                } else {
                    // if root node, shrink the height

                    // allocate new block for new root node
                    uint8_t *buf = alca(uint8_t, btree->blksize);
                    uint32_t nodesize = 0, new_rootsize = 0;
                    bid_t child_bid, new_root_bid;
                    struct bnode *new_root, *child;
                    struct btree_meta meta;

                    // read the child node
                    btree->kv_ops->get_kv(node[i], 0, k, v);
                    child_bid = btree->kv_ops->value2bid(v);
                    child_bid = _endian_decode(child_bid);
                    addr = btree->blk_ops->blk_read(btree->blk_handle, child_bid);
                    child = _fetch_bnode(btree, addr, btree->height);

                    nodesize = btree->blk_ops->blk_get_size(btree->blk_handle, child_bid);
#ifdef __CRC32
                    nodesize -= BLK_MARKER_SIZE;
#endif

                    // estimate the new root node size including metadata
                    meta.size = btree_read_meta(btree, buf);
                    meta.data = buf;

                    if (meta.size) {
                        new_rootsize += _metasize_align(meta.size) + sizeof(metasize_t);
                    }
                    new_rootsize += btree->kv_ops->get_data_size(child, NULL, NULL, NULL, 0);
                    new_rootsize += sizeof(struct bnode);

                    if (new_rootsize < nodesize) {
                        // new root node has enough space for metadata .. shrink height
                        btree->height--;

                        // allocate a new node with the given meta
                        addr = btree->blk_ops->blk_alloc(btree->blk_handle,
                                                         &new_root_bid);
                        _btree_init_node(btree, new_root_bid, addr,
                                         btree->root_flag, btree->height, &meta);
                        new_root = _fetch_bnode(btree, addr, btree->height);

                        // copy all entries
                        btree->kv_ops->copy_kv(new_root, child, 0, 0, child->nentry);
                        new_root->nentry = child->nentry;
                        // invalidate chlid node
                        btree->blk_ops->blk_remove(btree->blk_handle, child_bid);

                        btree->root_bid = new_root_bid;

                        // as the old node is invalidated,
                        // we don't need to move it.
                        modified[i] = 0;
                    }
                }
            }
        }

        if (modified[i]) {
            // when node is modified
            if (!btree->blk_ops->blk_is_writable(btree->blk_handle, bid[i])) {
                // already flushed block -> cannot overwrite, so
                // we have to move to new block
                // get new bid[i]
                addr = btree->blk_ops->blk_move(btree->blk_handle, bid[i],
                                                &bid[i]);
                node[i] = _fetch_bnode(btree, addr, i+1);
                moved[i] = 1;

                if (i+1 == btree->height)
                    // if moved node is root node
                    btree->root_bid = bid[i];

            }else{
                btree->blk_ops->blk_set_dirty(btree->blk_handle, bid[i]);
            }

        }
    }

    if (btree->blk_ops->blk_operation_end) {
        btree->blk_ops->blk_operation_end(btree->blk_handle);
    }
    if (btree->kv_ops->free_kv_var) {
        btree->kv_ops->free_kv_var(btree, k, v);
        btree->kv_ops->free_kv_var(btree, kk, vv);
    }
    return BTREE_RESULT_SUCCESS;
}